

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint __line;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  thread *thread;
  Test *args;
  char *__assertion;
  int iVar6;
  uint64_t i_1;
  bool bVar7;
  atomic<bool> flag;
  atomic<unsigned_long> sum;
  MPMCQueue<TestType> q;
  TestType t;
  __uniq_ptr_impl<int,_std::default_delete<int>_> local_1d8 [3];
  Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> local_1c0;
  TestType local_100;
  
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::Queue
            (&local_1c0,0xb,(allocator<rigtorp::mpmc::Slot<TestType>_> *)&local_100);
  if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
       local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) &&
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    iVar6 = 10;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
                (&local_1c0);
    }
    if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
         (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i == 10) &&
       (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
        local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
        -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
             (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
      if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count == 10) {
        TestType::TestType(&local_100);
        rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
                  (&local_1c0,&local_100);
        if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
             (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i == 9) &&
           (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
            local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
            -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                 (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
          if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count == 10) {
            rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
                      (&local_1c0,&local_100);
            rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::
            emplace<>(&local_1c0);
            if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                 (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i == 9) &&
               (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
                local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
                -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                     (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
              if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count == 10) {
                TestType::~TestType(&local_100);
                rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::
                ~Queue(&local_1c0);
                if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
                  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
                            ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,1,
                             (allocator<rigtorp::mpmc::Slot<int>_> *)&local_100);
                  local_100.data._0_8_ = local_100.data._0_8_ & 0xffffffff00000000;
                  local_1d8[0]._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_ = 1;
                  bVar7 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::
                          try_emplace<int>((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *
                                           )&local_1c0,(int *)local_1d8);
                  if (bVar7) {
                    if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                         (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i == 1) &&
                       (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
                        local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
                        -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                             (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
                      local_1d8[0]._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_ = 2;
                      bVar7 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>
                              ::try_emplace<int>((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>
                                                  *)&local_1c0,(int *)local_1d8);
                      if (bVar7) {
                        __assertion = "q.try_push(2) == false";
                        __line = 0x65;
                      }
                      else if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                                (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i == 1)
                              && (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
                                  local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
                                  -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i
                                       - (long)local_1c0.tail_.super___atomic_base<unsigned_long>.
                                               _M_i)) {
                        bVar7 = rigtorp::mpmc::
                                Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                                          ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *
                                           )&local_1c0,(int *)&local_100);
                        if ((bVar7) && (local_100.data._0_4_ == 1)) {
                          if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
                               local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) &&
                             (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
                              local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
                              (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                              (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
                            bVar7 = rigtorp::mpmc::
                                    Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                                              ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>
                                                *)&local_1c0,(int *)&local_100);
                            if ((bVar7) || (local_100.data._0_4_ != 1)) {
                              __assertion = "q.try_pop(t) == false && t == 1";
                              __line = 0x69;
                            }
                            else {
                              if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
                                   local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) &&
                                 (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
                                  local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
                                  (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
                                  (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)
                                 ) {
                                rigtorp::mpmc::
                                Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue
                                          ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *
                                           )&local_1c0);
                                local_1c0.capacity_ = 0x10;
                                local_1c0.head_.super___atomic_base<unsigned_long>._M_i =
                                     (__atomic_base<unsigned_long>)0;
                                local_1c0.tail_.super___atomic_base<unsigned_long>._M_i =
                                     (__atomic_base<unsigned_long>)0;
                                args = (Test *)0x40;
                                local_1c0.slots_ = (Slot<TestType> *)operator_new(0x440,0x40);
                                for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 0x40) {
                                  puVar1 = (undefined8 *)
                                           ((long)&(local_1c0.slots_)->storage + lVar4 + 0x28);
                                  *puVar1 = 0;
                                  puVar1[1] = 0;
                                  puVar1 = (undefined8 *)
                                           ((long)&(local_1c0.slots_)->storage + lVar4 + 0x18);
                                  *puVar1 = 0;
                                  puVar1[1] = 0;
                                  puVar1 = (undefined8 *)
                                           ((long)&(local_1c0.slots_)->storage + lVar4 + 8);
                                  *puVar1 = 0;
                                  puVar1[1] = 0;
                                  puVar1 = (undefined8 *)
                                           ((long)&((local_1c0.slots_)->turn).
                                                   super___atomic_base<unsigned_long>._M_i + lVar4);
                                  *puVar1 = 0;
                                  puVar1[1] = 0;
                                }
                                rigtorp::mpmc::
                                Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
                                emplace<main::Test&>
                                          ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>
                                            *)&local_1c0,args);
                                rigtorp::mpmc::
                                Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
                                try_emplace<main::Test&>
                                          ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>
                                            *)&local_1c0,args);
                                rigtorp::mpmc::
                                Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
                                emplace<main::Test&>
                                          ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>
                                            *)&local_1c0,args);
                                rigtorp::mpmc::
                                Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
                                try_emplace<main::Test&>
                                          ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>
                                            *)&local_1c0,args);
                                LOCK();
                                UNLOCK();
                                do {
                                } while (((ulong)local_1c0.head_.super___atomic_base<unsigned_long>.
                                                 _M_i / local_1c0.capacity_) * 2 !=
                                         (&(local_1c0.slots_)->turn)
                                         [((ulong)local_1c0.head_.super___atomic_base<unsigned_long>
                                                  ._M_i % local_1c0.capacity_) * 8].
                                         super___atomic_base<unsigned_long>._M_i);
                                (&(local_1c0.slots_)->turn)
                                [((ulong)local_1c0.head_.super___atomic_base<unsigned_long>._M_i %
                                 local_1c0.capacity_) * 8].super___atomic_base<unsigned_long>._M_i =
                                     ((ulong)local_1c0.head_.super___atomic_base<unsigned_long>._M_i
                                     / local_1c0.capacity_) * 2 + 1;
                                aVar3.super___atomic_base<unsigned_long>._M_i =
                                     (__atomic_base<unsigned_long>)
                                     (__atomic_base<unsigned_long>)
                                     ((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i
                                     + 1U);
                                local_1c0.head_.super___atomic_base<unsigned_long>._M_i =
                                     (__atomic_base<unsigned_long>)
                                     (__atomic_base<unsigned_long>)
                                     ((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i
                                     + 1U);
                                do {
                                  while (uVar5 = (ulong)aVar3.super___atomic_base<unsigned_long>.
                                                        _M_i,
                                        (uVar5 / local_1c0.capacity_) * 2 !=
                                        (&(local_1c0.slots_)->turn)
                                        [(uVar5 % local_1c0.capacity_) * 8].
                                        super___atomic_base<unsigned_long>._M_i) {
                                    aVar3.super___atomic_base<unsigned_long>._M_i =
                                         (__atomic_base<unsigned_long>)
                                         (__atomic_base<unsigned_long>)local_1c0.head_;
                                    if (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
                                        (__atomic_base<unsigned_long>)uVar5) goto LAB_0010292b;
                                  }
                                  LOCK();
                                  bVar7 = (__atomic_base<unsigned_long>)uVar5 !=
                                          local_1c0.head_.super___atomic_base<unsigned_long>._M_i;
                                  aVar3.super___atomic_base<unsigned_long>._M_i =
                                       (__atomic_base<unsigned_long>)
                                       (__atomic_base<unsigned_long>)uVar5;
                                  _Var2._M_i = uVar5 + 1;
                                  if (bVar7) {
                                    aVar3.super___atomic_base<unsigned_long>._M_i =
                                         (__atomic_base<unsigned_long>)
                                         (__atomic_base<unsigned_long>)local_1c0.head_;
                                    _Var2 = local_1c0.head_.super___atomic_base<unsigned_long>._M_i;
                                  }
                                  local_1c0.head_.super___atomic_base<unsigned_long>._M_i =
                                       (__atomic_base<unsigned_long>)
                                       (__atomic_base<unsigned_long>)_Var2._M_i;
                                  UNLOCK();
                                } while (bVar7);
                                (&(local_1c0.slots_)->turn)[(uVar5 % local_1c0.capacity_) * 8].
                                super___atomic_base<unsigned_long>._M_i =
                                     (uVar5 / local_1c0.capacity_) * 2 + 1;
LAB_0010292b:
                                for (uVar5 = 0; uVar5 < local_1c0.capacity_; uVar5 = uVar5 + 1) {
                                }
                                operator_delete(local_1c0.slots_,local_1c0.capacity_ * 0x40 + 0x40,
                                                0x40);
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                ::Queue((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                         *)&local_1c0,0x10,
                                        (allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                                         *)&local_100);
                                local_100.data._0_8_ = operator_new(4);
                                *(undefined4 *)local_100.data._0_8_ = 1;
                                local_1d8[0]._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl =
                                     (tuple<int_*,_std::default_delete<int>_>)operator_new(4);
                                *(undefined4 *)
                                 local_1d8[0]._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl = 1;
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
                                ::emplace<std::unique_ptr<int,std::default_delete<int>>>
                                          ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                            *)&local_1c0,
                                           (unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                                          ((unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                local_1d8[0]._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl =
                                     (tuple<int_*,_std::default_delete<int>_>)operator_new(4);
                                *(undefined4 *)
                                 local_1d8[0]._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl = 1;
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
                                ::try_emplace<std::unique_ptr<int,std::default_delete<int>>>
                                          ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                            *)&local_1c0,
                                           (unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                                          ((unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                local_1d8[0]._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl =
                                     (tuple<int_*,_std::default_delete<int>_>)operator_new(4);
                                *(undefined4 *)
                                 local_1d8[0]._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl = 1;
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
                                ::emplace<std::unique_ptr<int,std::default_delete<int>>>
                                          ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                            *)&local_1c0,
                                           (unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                                          ((unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                local_1d8[0]._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl =
                                     (tuple<int_*,_std::default_delete<int>_>)operator_new(4);
                                *(undefined4 *)
                                 local_1d8[0]._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl = 1;
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
                                ::try_emplace<std::unique_ptr<int,std::default_delete<int>>>
                                          ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                            *)&local_1c0,
                                           (unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                                          ((unique_ptr<int,_std::default_delete<int>_> *)local_1d8);
                                std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                                          ((unique_ptr<int,_std::default_delete<int>_> *)&local_100)
                                ;
                                rigtorp::mpmc::
                                Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                ::~Queue((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                                          *)&local_1c0);
                                rigtorp::mpmc::
                                Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
                                          ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *
                                           )&local_1c0,0,
                                           (allocator<rigtorp::mpmc::Slot<int>_> *)&local_100);
                                rigtorp::mpmc::
                                Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue
                                          ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *
                                           )&local_1c0);
                                __assert_fail("throws == true",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                                              ,0x98,"int main(int, char **)");
                              }
                              __assertion = "q.size() == 0 && q.empty()";
                              __line = 0x6a;
                            }
                          }
                          else {
                            __assertion = "q.size() == 0 && q.empty()";
                            __line = 0x68;
                          }
                        }
                        else {
                          __assertion = "q.try_pop(t) == true && t == 1";
                          __line = 0x67;
                        }
                      }
                      else {
                        __assertion = "q.size() == 1 && !q.empty()";
                        __line = 0x66;
                      }
                    }
                    else {
                      __assertion = "q.size() == 1 && !q.empty()";
                      __line = 100;
                    }
                  }
                  else {
                    __assertion = "q.try_push(1) == true";
                    __line = 99;
                  }
                }
                else {
                  __assertion = "TestType::constructed.size() == 0";
                  __line = 0x5e;
                }
              }
              else {
                __assertion = "TestType::constructed.size() == 10";
                __line = 0x5c;
              }
            }
            else {
              __assertion = "q.size() == 9 && !q.empty()";
              __line = 0x5b;
            }
          }
          else {
            __assertion = "TestType::constructed.size() == 10";
            __line = 0x57;
          }
        }
        else {
          __assertion = "q.size() == 9 && !q.empty()";
          __line = 0x56;
        }
      }
      else {
        __assertion = "TestType::constructed.size() == 10";
        __line = 0x52;
      }
    }
    else {
      __assertion = "q.size() == 10 && !q.empty()";
      __line = 0x51;
    }
  }
  else {
    __assertion = "q.size() == 0 && q.empty()";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  {
    MPMCQueue<TestType> q(11);
    assert(q.size() == 0 && q.empty());
    for (int i = 0; i < 10; i++) {
      q.emplace();
    }
    assert(q.size() == 10 && !q.empty());
    assert(TestType::constructed.size() == 10);

    TestType t;
    q.pop(t);
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);

    q.pop(t);
    q.emplace();
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);
  }
  assert(TestType::constructed.size() == 0);

  {
    MPMCQueue<int> q(1);
    int t = 0;
    assert(q.try_push(1) == true);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_push(2) == false);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_pop(t) == true && t == 1);
    assert(q.size() == 0 && q.empty());
    assert(q.try_pop(t) == false && t == 1);
    assert(q.size() == 0 && q.empty());
  }

  // Copyable only type
  {
    struct Test {
      Test() {}
      Test(const Test &) noexcept {}
      Test &operator=(const Test &) noexcept { return *this; }
      Test(Test &&) = delete;
    };
    MPMCQueue<Test> q(16);
    // lvalue
    Test v;
    q.emplace(v);
    q.try_emplace(v);
    q.push(v);
    q.try_push(v);
    // xvalue
    q.push(Test());
    q.try_push(Test());
  }

  // Movable only type
  {
    MPMCQueue<std::unique_ptr<int>> q(16);
    // lvalue
    auto v = std::unique_ptr<int>(new int(1));
    // q.emplace(v);
    // q.try_emplace(v);
    // q.push(v);
    // q.try_push(v);
    // xvalue
    q.emplace(std::unique_ptr<int>(new int(1)));
    q.try_emplace(std::unique_ptr<int>(new int(1)));
    q.push(std::unique_ptr<int>(new int(1)));
    q.try_push(std::unique_ptr<int>(new int(1)));
  }

  {
    bool throws = false;
    try {
      MPMCQueue<int> q(0);
    } catch (std::exception &) {
      throws = true;
    }
    assert(throws == true);
  }

  // Fuzz test
  {
    const uint64_t numOps = 1000;
    const uint64_t numThreads = 10;
    MPMCQueue<uint64_t> q(numThreads);
    std::atomic<bool> flag(false);
    std::vector<std::thread> threads;
    std::atomic<uint64_t> sum(0);
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        for (auto j = i; j < numOps; j += numThreads) {
          q.push(j);
        }
      }));
    }
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        uint64_t threadSum = 0;
        for (auto j = i; j < numOps; j += numThreads) {
          uint64_t v;
          q.pop(v);
          threadSum += v;
        }
        sum += threadSum;
      }));
    }
    flag = true;
    for (auto &thread : threads) {
      thread.join();
    }
    assert(sum == numOps * (numOps - 1) / 2);
  }

  return 0;
}